

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::operator++(depth_first_traverser *this)

{
  pointer pcVar1;
  child_t<clipp::parameter,_clipp::group> *__args;
  
  pcVar1 = (this->stack_).
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != pcVar1) {
    __args = pcVar1[-1].cur._M_current;
    if (__args->type_ == group) {
      std::
      vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>
      ::emplace_back<clipp::group_const&>
                ((vector<clipp::group::depth_first_traverser::context,std::allocator<clipp::group::depth_first_traverser::context>>
                  *)this,(group *)__args);
    }
    else {
      next_sibling(this);
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        operator ++ () {
            if(stack_.empty()) return *this;
            //at group -> decend into group
            if(stack_.back().cur->is_group()) {
                stack_.emplace_back(stack_.back().cur->as_group());
            }
            else {
                next_sibling();
            }
            return *this;
        }